

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::flattened_access_chain_vector_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t base,uint32_t *indices,
          uint32_t count,SPIRType *target_type,uint32_t offset,uint32_t matrix_stride,
          bool need_transpose)

{
  uint32_t uVar1;
  SPIRType *pSVar2;
  char *pcVar3;
  uint local_11c;
  string local_118;
  undefined1 local_f5;
  uint local_f4;
  undefined4 local_f0;
  uint32_t index_1;
  string local_e8;
  uint local_c4;
  uint local_c0;
  uint32_t index;
  uint32_t component_offset;
  uint32_t i;
  undefined1 local_95;
  string local_88 [8];
  string buffer_name;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  result;
  bool need_transpose_local;
  SPIRType *target_type_local;
  uint32_t count_local;
  uint32_t *indices_local;
  uint32_t base_local;
  CompilerGLSL *this_local;
  string *expr;
  
  pSVar2 = Compiler::expression_type(&this->super_Compiler,base);
  flattened_access_chain_offset_abi_cxx11_
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)((long)&buffer_name.field_2 + 8),this,pSVar2,indices,count,offset,0x10,(bool *)0x0,
             (uint32_t *)0x0,(uint32_t *)0x0,false);
  pSVar2 = Compiler::expression_type(&this->super_Compiler,base);
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar2->super_IVariant).self);
  (*(this->super_Compiler)._vptr_Compiler[6])(local_88,this,(ulong)uVar1,1);
  if (need_transpose) {
    local_95 = 0;
    ::std::__cxx11::string::string((string *)__return_storage_ptr__);
    if (1 < target_type->vecsize) {
      type_to_glsl_constructor_abi_cxx11_((string *)&component_offset,this,target_type);
      ::std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&component_offset);
      ::std::__cxx11::string::~string((string *)&component_offset);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(");
    }
    for (index = 0; index < target_type->vecsize; index = index + 1) {
      if (index != 0) {
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
      }
      local_c0 = result.first.field_2._8_4_ + index * matrix_stride;
      if (local_c0 % (target_type->width >> 3) != 0) {
        __assert_fail("component_offset % (target_type.width / 8) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_glsl.cpp"
                      ,0x2aff,
                      "std::string spirv_cross::CompilerGLSL::flattened_access_chain_vector(uint32_t, const uint32_t *, uint32_t, const SPIRType &, uint32_t, uint32_t, bool)"
                     );
      }
      local_c4 = local_c0 / (target_type->width >> 3);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_88);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"[");
      ::std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)(buffer_name.field_2._M_local_buf + 8));
      index_1 = local_c4 >> 2;
      convert_to_string<unsigned_int,_0>(&local_e8,&index_1);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_e8);
      ::std::__cxx11::string::~string((string *)&local_e8);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"]");
      pcVar3 = vector_swizzle(1,local_c4 & 3);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar3);
    }
    if (1 < target_type->vecsize) {
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
    }
    local_95 = 1;
  }
  else {
    if ((uint)result.first.field_2._8_4_ % (target_type->width >> 3) != 0) {
      __assert_fail("result.second % (target_type.width / 8) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_glsl.cpp"
                    ,0x2b14,
                    "std::string spirv_cross::CompilerGLSL::flattened_access_chain_vector(uint32_t, const uint32_t *, uint32_t, const SPIRType &, uint32_t, uint32_t, bool)"
                   );
    }
    local_f4 = (uint)result.first.field_2._8_4_ / (target_type->width >> 3);
    local_f5 = 0;
    ::std::__cxx11::string::string((string *)__return_storage_ptr__);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_88);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"[");
    ::std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(string *)(buffer_name.field_2._M_local_buf + 8));
    local_11c = local_f4 >> 2;
    convert_to_string<unsigned_int,_0>(&local_118,&local_11c);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_118);
    ::std::__cxx11::string::~string((string *)&local_118);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"]");
    pcVar3 = vector_swizzle(target_type->vecsize,local_f4 & 3);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar3);
    local_f5 = 1;
  }
  local_f0 = 1;
  ::std::__cxx11::string::~string(local_88);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
           *)((long)&buffer_name.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerGLSL::flattened_access_chain_vector(uint32_t base, const uint32_t *indices, uint32_t count,
                                                        const SPIRType &target_type, uint32_t offset,
                                                        uint32_t matrix_stride, bool need_transpose)
{
	auto result = flattened_access_chain_offset(expression_type(base), indices, count, offset, 16);

	auto buffer_name = to_name(expression_type(base).self);

	if (need_transpose)
	{
		std::string expr;

		if (target_type.vecsize > 1)
		{
			expr += type_to_glsl_constructor(target_type);
			expr += "(";
		}

		for (uint32_t i = 0; i < target_type.vecsize; ++i)
		{
			if (i != 0)
				expr += ", ";

			uint32_t component_offset = result.second + i * matrix_stride;

			assert(component_offset % (target_type.width / 8) == 0);
			uint32_t index = component_offset / (target_type.width / 8);

			expr += buffer_name;
			expr += "[";
			expr += result.first; // this is a series of N1 * k1 + N2 * k2 + ... that is either empty or ends with a +
			expr += convert_to_string(index / 4);
			expr += "]";

			expr += vector_swizzle(1, index % 4);
		}

		if (target_type.vecsize > 1)
		{
			expr += ")";
		}

		return expr;
	}
	else
	{
		assert(result.second % (target_type.width / 8) == 0);
		uint32_t index = result.second / (target_type.width / 8);

		std::string expr;

		expr += buffer_name;
		expr += "[";
		expr += result.first; // this is a series of N1 * k1 + N2 * k2 + ... that is either empty or ends with a +
		expr += convert_to_string(index / 4);
		expr += "]";

		expr += vector_swizzle(target_type.vecsize, index % 4);

		return expr;
	}
}